

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantSetSuppAnd(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  Gia_Obj_t *pGVar5;
  word *pwVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  pGVar3 = p->pObjs;
  if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
    uVar4 = *(undefined8 *)pObj;
    uVar11 = (uint)uVar4;
    if (((int)uVar11 < 0) || ((uVar11 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                    ,0x95,"void Gia_ManQuantSetSuppAnd(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManQuantSetSuppZero(p);
    pGVar5 = p->pObjs;
    if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
      uVar1 = p->nSuppWords;
      iVar8 = uVar1 * (int)((ulong)((long)pObj - (long)pGVar5) >> 2);
      uVar7 = iVar8 * -0x55555555;
      if (-1 < (int)uVar7) {
        uVar2 = p->vSuppWords->nSize;
        if (uVar2 != uVar7 && SBORROW4(uVar2,uVar7) == (int)(uVar2 + iVar8 * 0x55555555) < 0) {
          iVar8 = (int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555;
          uVar11 = (iVar8 - (uVar11 & 0x1fffffff)) * uVar1;
          if ((((-1 < (int)uVar11) && (uVar11 < uVar2)) &&
              (uVar9 = (iVar8 - ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff)) * uVar1,
              -1 < (int)uVar9)) && (uVar9 < uVar2)) {
            if (0 < (int)uVar1) {
              pwVar6 = p->vSuppWords->pArray;
              uVar10 = 0;
              do {
                pwVar6[uVar7 + uVar10] = pwVar6[uVar9 + uVar10] | pwVar6[uVar11 + uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar1 != uVar10);
            }
            return;
          }
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManQuantSetSuppAnd( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int iObj  = Gia_ObjId(p, pObj);
    int iFan0 = Gia_ObjFaninId0(pObj, iObj);
    int iFan1 = Gia_ObjFaninId1(pObj, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManQuantSetSuppZero( p );
    Abc_TtOr( Gia_ManQuantInfo(p, pObj), Gia_ManQuantInfoId(p, iFan0), Gia_ManQuantInfoId(p, iFan1), p->nSuppWords );
}